

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

PropertyDef * __thiscall PropertyDef::toJson(PropertyDef *this)

{
  long in_RSI;
  long in_FS_OFFSET;
  undefined1 auVar1 [16];
  QByteArrayView QVar2;
  QLatin1String QVar3;
  QByteArrayView QVar4;
  QLatin1String QVar5;
  QByteArrayView QVar6;
  QLatin1String QVar7;
  QByteArrayView QVar8;
  QLatin1String QVar9;
  QByteArrayView QVar10;
  QLatin1String QVar11;
  QByteArrayView QVar12;
  QLatin1String QVar13;
  QByteArrayView QVar14;
  QLatin1String QVar15;
  QByteArrayView QVar16;
  QLatin1String QVar17;
  QByteArrayView QVar18;
  QLatin1String QVar19;
  QLatin1String QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  undefined1 local_68 [16];
  QString local_58;
  QJsonValue local_40 [24];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->name).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)this);
  QVar2.m_data = *(storage_type **)(in_RSI + 0x10);
  QVar2.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar2);
  QJsonValue::QJsonValue(local_40,&local_58);
  QVar3.m_data = (char *)0x4;
  QVar3.m_size = (qsizetype)this;
  local_68 = QJsonObject::operator[](QVar3);
  QJsonValueRef::operator=((QJsonValueRef *)local_68,local_40);
  QJsonValue::~QJsonValue(local_40);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar4.m_data = *(storage_type **)(in_RSI + 0x28);
  QVar4.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar4);
  QJsonValue::QJsonValue(local_40,&local_58);
  QVar5.m_data = (char *)0x4;
  QVar5.m_size = (qsizetype)this;
  auVar1 = QJsonObject::operator[](QVar5);
  local_68 = auVar1;
  QJsonValueRef::operator=((QJsonValueRef *)local_68,local_40);
  QJsonValue::~QJsonValue(local_40);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(storage_type **)(in_RSI + 0x40) != (storage_type *)0x0) {
    QVar6.m_data = *(storage_type **)(in_RSI + 0x40);
    QVar6.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar6);
    QJsonValue::QJsonValue(local_40,&local_58);
    QVar7.m_data = (char *)0x6;
    QVar7.m_size = (qsizetype)this;
    auVar1 = QJsonObject::operator[](QVar7);
    local_68 = auVar1;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,local_40);
    QJsonValue::~QJsonValue(local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(storage_type **)(in_RSI + 0x58) != (storage_type *)0x0) {
    QVar8.m_data = *(storage_type **)(in_RSI + 0x58);
    QVar8.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar8);
    QJsonValue::QJsonValue(local_40,&local_58);
    QVar9.m_data = (char *)0x4;
    QVar9.m_size = (qsizetype)this;
    auVar1 = QJsonObject::operator[](QVar9);
    local_68 = auVar1;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,local_40);
    QJsonValue::~QJsonValue(local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(storage_type **)(in_RSI + 0x70) != (storage_type *)0x0) {
    QVar10.m_data = *(storage_type **)(in_RSI + 0x70);
    QVar10.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar10);
    QJsonValue::QJsonValue(local_40,&local_58);
    QVar11.m_data = (char *)0x5;
    QVar11.m_size = (qsizetype)this;
    auVar1 = QJsonObject::operator[](QVar11);
    local_68 = auVar1;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,local_40);
    QJsonValue::~QJsonValue(local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(storage_type **)(in_RSI + 0x88) != (storage_type *)0x0) {
    QVar12.m_data = *(storage_type **)(in_RSI + 0x88);
    QVar12.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar12);
    QJsonValue::QJsonValue(local_40,&local_58);
    QVar13.m_data = (char *)0x8;
    QVar13.m_size = (qsizetype)this;
    auVar1 = QJsonObject::operator[](QVar13);
    local_68 = auVar1;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,local_40);
    QJsonValue::~QJsonValue(local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(storage_type **)(in_RSI + 0xa0) != (storage_type *)0x0) {
    QVar14.m_data = *(storage_type **)(in_RSI + 0xa0);
    QVar14.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar14);
    QJsonValue::QJsonValue(local_40,&local_58);
    QVar15.m_data = (char *)0x5;
    QVar15.m_size = (qsizetype)this;
    auVar1 = QJsonObject::operator[](QVar15);
    local_68 = auVar1;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,local_40);
    QJsonValue::~QJsonValue(local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(storage_type **)(in_RSI + 0x118) != (storage_type *)0x0) {
    QVar16.m_data = *(storage_type **)(in_RSI + 0x118);
    QVar16.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar16);
    QJsonValue::QJsonValue(local_40,&local_58);
    QVar17.m_data = (char *)0x6;
    QVar17.m_size = (qsizetype)this;
    auVar1 = QJsonObject::operator[](QVar17);
    local_68 = auVar1;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,local_40);
    QJsonValue::~QJsonValue(local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(storage_type **)(in_RSI + 0x130) != (storage_type *)0x0) {
    QVar18.m_data = *(storage_type **)(in_RSI + 0x130);
    QVar18.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar18);
    QJsonValue::QJsonValue(local_40,&local_58);
    QVar19.m_data = (char *)0xc;
    QVar19.m_size = (qsizetype)this;
    auVar1 = QJsonObject::operator[](QVar19);
    local_68 = auVar1;
    QJsonValueRef::operator=((QJsonValueRef *)local_68,local_40);
    QJsonValue::~QJsonValue(local_40);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  local_68._0_8_ = this;
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)local_68,"designable",(QByteArray *)(in_RSI + 0xa8));
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)local_68,"scriptable",(QByteArray *)(in_RSI + 0xc0));
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)local_68,"stored",(QByteArray *)(in_RSI + 0xd8));
  toJson::anon_class_8_1_89905061::operator()
            ((anon_class_8_1_89905061 *)local_68,"user",(QByteArray *)(in_RSI + 0xf0));
  QJsonValue::QJsonValue(local_40,*(bool *)(in_RSI + 0x148));
  QVar20.m_data = (char *)0x8;
  QVar20.m_size = (qsizetype)this;
  local_58.d._0_16_ = QJsonObject::operator[](QVar20);
  QJsonValueRef::operator=((QJsonValueRef *)&local_58,local_40);
  QJsonValue::~QJsonValue(local_40);
  QJsonValue::QJsonValue(local_40,*(bool *)(in_RSI + 0x149));
  QVar21.m_data = (char *)0x5;
  QVar21.m_size = (qsizetype)this;
  auVar1 = QJsonObject::operator[](QVar21);
  local_58.d._0_16_ = auVar1;
  QJsonValueRef::operator=((QJsonValueRef *)&local_58,local_40);
  QJsonValue::~QJsonValue(local_40);
  QJsonValue::QJsonValue(local_40,*(bool *)(in_RSI + 0x14a));
  QVar22.m_data = (char *)0x8;
  QVar22.m_size = (qsizetype)this;
  auVar1 = QJsonObject::operator[](QVar22);
  local_58.d._0_16_ = auVar1;
  QJsonValueRef::operator=((QJsonValueRef *)&local_58,local_40);
  QJsonValue::~QJsonValue(local_40);
  QJsonValue::QJsonValue(local_40,*(int *)(in_RSI + 0x14c));
  QVar23.m_data = (char *)0x5;
  QVar23.m_size = (qsizetype)this;
  auVar1 = QJsonObject::operator[](QVar23);
  local_58.d._0_16_ = auVar1;
  QJsonValueRef::operator=((QJsonValueRef *)&local_58,local_40);
  QJsonValue::~QJsonValue(local_40);
  if (0 < *(int *)(in_RSI + 0x140)) {
    QJsonValue::QJsonValue(local_40,*(int *)(in_RSI + 0x140));
    QVar24.m_data = (char *)0x8;
    QVar24.m_size = (qsizetype)this;
    auVar1 = QJsonObject::operator[](QVar24);
    local_58.d._0_16_ = auVar1;
    QJsonValueRef::operator=((QJsonValueRef *)&local_58,local_40);
    QJsonValue::~QJsonValue(local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject PropertyDef::toJson() const
{
    QJsonObject prop;
    prop["name"_L1] = QString::fromUtf8(name);
    prop["type"_L1] = QString::fromUtf8(type);

    const auto jsonify = [&prop](const char *str, const QByteArray &member) {
        if (!member.isEmpty())
            prop[QLatin1StringView(str)] = QString::fromUtf8(member);
    };

    jsonify("member", member);
    jsonify("read", read);
    jsonify("write", write);
    jsonify("bindable", bind);
    jsonify("reset", reset);
    jsonify("notify", notify);
    jsonify("privateClass", inPrivateClass);

    const auto jsonifyBoolOrString = [&prop](const char *str, const QByteArray &boolOrString) {
        QJsonValue value;
        if (boolOrString == "true")
            value = true;
        else if (boolOrString == "false")
            value = false;
        else
            value = QString::fromUtf8(boolOrString); // function name to query at run-time
        prop[QLatin1StringView(str)] = value;
    };

    jsonifyBoolOrString("designable", designable);
    jsonifyBoolOrString("scriptable", scriptable);
    jsonifyBoolOrString("stored", stored);
    jsonifyBoolOrString("user", user);

    prop["constant"_L1] = constant;
    prop["final"_L1] = final;
    prop["required"_L1] = required;
    prop["index"_L1] = relativeIndex;
    if (revision > 0)
        prop["revision"_L1] = revision;

    return prop;
}